

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O1

DSA_SIG * DSA_do_sign(uchar *dgst,int dlen,DSA *dsa)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  BIGNUM *a;
  BN_CTX *ctx;
  BIGNUM *pBVar5;
  BIGNUM *out;
  BN_MONT_CTX *pBVar6;
  BIGNUM *a_00;
  size_t words;
  int lock;
  undefined4 in_register_00000034;
  ulong uVar7;
  bool bVar8;
  BIGNUM *a_01;
  BIGNUM m;
  BIGNUM xr;
  BIGNUM *local_c8;
  BIGNUM *local_c0;
  DSA_SIG *local_a8;
  BIGNUM local_78;
  BIGNUM local_60;
  BIGNUM local_48;
  
  uVar7 = CONCAT44(in_register_00000034,dlen);
  iVar2 = dsa_check_key((DSA *)dsa);
  if (iVar2 == 0) {
    local_a8 = (DSA_SIG *)0x0;
  }
  else if (dsa->q == (BIGNUM *)0x0) {
    local_a8 = (DSA_SIG *)0x0;
    ERR_put_error(10,0,0x65,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                  ,0x217);
  }
  else {
    BN_init(&local_78);
    BN_init(&local_48);
    a = BN_new();
    if ((a == (BIGNUM *)0x0) || (ctx = (BN_CTX *)BN_CTX_new(), ctx == (BN_CTX *)0x0)) {
      local_c0 = (BIGNUM *)0x0;
      local_c8 = (BIGNUM *)0x0;
      ctx = (BN_CTX *)0x0;
      local_a8 = (DSA_SIG *)0x0;
    }
    else {
      iVar2 = 0;
      lock = (int)dsa + 0x28;
      local_c0 = (BIGNUM *)0x0;
      local_c8 = (BIGNUM *)0x0;
      local_a8 = (DSA_SIG *)0x0;
      do {
        BN_init(&local_60);
        pBVar5 = BN_new();
        out = BN_new();
        if ((((out == (BIGNUM *)0x0 || pBVar5 == (BIGNUM *)0x0) ||
             (iVar3 = BN_rand_range_ex((BIGNUM *)&local_60,1,(BIGNUM *)dsa->version), iVar3 == 0))
            || (pBVar6 = BN_MONT_CTX_set_locked
                                   ((BN_MONT_CTX **)&dsa->references,lock,*(BIGNUM **)dsa,
                                    (BN_CTX *)ctx), (int)pBVar6 == 0)) ||
           ((pBVar6 = BN_MONT_CTX_set_locked
                                ((BN_MONT_CTX **)&dsa->ex_data,lock,(BIGNUM *)dsa->version,
                                 (BN_CTX *)ctx), (int)pBVar6 == 0 ||
            (iVar3 = BN_mod_exp_mont_consttime
                               (pBVar5,*(BIGNUM **)&dsa->write_params,&local_60,*(BIGNUM **)dsa,
                                (BN_CTX *)ctx,*(BN_MONT_CTX **)&dsa->references), iVar3 == 0)))) {
          iVar3 = 0x363;
LAB_00481878:
          ERR_put_error(10,0,3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                        ,iVar3);
          bVar1 = true;
          a_00 = out;
          a_01 = pBVar5;
        }
        else {
          iVar3 = BN_div((BIGNUM *)0x0,pBVar5,pBVar5,(BIGNUM *)dsa->version,(BN_CTX *)ctx);
          if ((iVar3 == 0) ||
             (iVar3 = bn_mod_inverse_prime
                                ((BIGNUM *)out,(BIGNUM *)&local_60,(BIGNUM *)dsa->version,ctx,
                                 (BN_MONT_CTX *)(dsa->ex_data).sk), iVar3 == 0)) {
            iVar3 = 0x372;
            goto LAB_00481878;
          }
          BN_clear_free(local_c0);
          BN_clear_free(local_c8);
          bVar1 = false;
          a_00 = (BIGNUM *)0x0;
          a_01 = (BIGNUM *)0x0;
          local_c8 = pBVar5;
          local_c0 = out;
        }
        BN_clear_free(&local_60);
        BN_clear_free(a_01);
        BN_clear_free(a_00);
        bVar8 = false;
        if (bVar1) break;
        uVar4 = BN_num_bytes((BIGNUM *)dsa->version);
        if (uVar4 < uVar7) {
          uVar4 = BN_num_bytes((BIGNUM *)dsa->version);
          uVar7 = (ulong)uVar4;
        }
        pBVar5 = BN_bin2bn(dgst,(int)uVar7,&local_78);
        if (pBVar5 == (BIGNUM *)0x0) break;
        iVar3 = bn_minimal_width((BIGNUM *)dsa->version);
        words = (size_t)iVar3;
        iVar3 = bn_resize_words((BIGNUM *)&local_78,words);
        bVar8 = false;
        if (iVar3 != 0) {
          iVar3 = bn_resize_words((BIGNUM *)&local_48,words);
          if (iVar3 != 0) {
            bn_reduce_once_in_place(local_78.d,0,*(BN_ULONG **)dsa->version,local_48.d,words);
            iVar3 = mod_mul_consttime((BIGNUM *)&local_48,(BIGNUM *)dsa->q,(BIGNUM *)local_c8,
                                      (BN_MONT_CTX *)(dsa->ex_data).sk,ctx);
            if (((iVar3 != 0) &&
                (iVar3 = bn_mod_add_consttime
                                   ((BIGNUM *)a,(BIGNUM *)&local_48,(BIGNUM *)&local_78,
                                    (BIGNUM *)dsa->version,ctx), iVar3 != 0)) &&
               (iVar3 = mod_mul_consttime((BIGNUM *)a,(BIGNUM *)a,(BIGNUM *)local_c0,
                                          (BN_MONT_CTX *)(dsa->ex_data).sk,ctx), iVar3 != 0)) {
              iVar3 = BN_is_zero((BIGNUM *)local_c8);
              if ((iVar3 == 0) && (iVar3 = BN_is_zero((BIGNUM *)a), iVar3 == 0)) {
                local_a8 = (DSA_SIG *)OPENSSL_zalloc(0x10);
                if (local_a8 == (DSA_SIG *)0x0) {
                  local_a8 = (DSA_SIG *)0x0;
                }
                else {
                  local_a8->r = local_c8;
                  local_a8->s = a;
                  bVar8 = false;
                }
              }
              else {
                iVar3 = iVar2 + 1;
                bVar8 = iVar2 < 0x20;
                iVar2 = iVar3;
                if (!bVar8) {
                  ERR_put_error(10,0,0x6c,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                                ,0x261);
                }
              }
            }
          }
        }
      } while (bVar8);
      if (bVar8) {
        return local_a8;
      }
    }
    if (local_a8 == (DSA_SIG *)0x0) {
      ERR_put_error(10,0,3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa.cc"
                    ,0x271);
      BN_free(local_c8);
      BN_free(a);
    }
    BN_CTX_free((BN_CTX *)ctx);
    BN_clear_free(&local_78);
    BN_clear_free(&local_48);
    BN_clear_free(local_c0);
  }
  return local_a8;
}

Assistant:

DSA_SIG *DSA_do_sign(const uint8_t *digest, size_t digest_len, const DSA *dsa) {
  if (!dsa_check_key(dsa)) {
    return NULL;
  }

  if (dsa->priv_key == NULL) {
    OPENSSL_PUT_ERROR(DSA, DSA_R_MISSING_PARAMETERS);
    return NULL;
  }

  BIGNUM *kinv = NULL, *r = NULL, *s = NULL;
  BIGNUM m;
  BIGNUM xr;
  BN_CTX *ctx = NULL;
  DSA_SIG *ret = NULL;

  BN_init(&m);
  BN_init(&xr);
  s = BN_new();
  {
    if (s == NULL) {
      goto err;
    }
    ctx = BN_CTX_new();
    if (ctx == NULL) {
      goto err;
    }

    // Cap iterations so that invalid parameters do not infinite loop. This does
    // not impact valid parameters because the probability of requiring even one
    // retry is negligible, let alone 32. Unfortunately, DSA was mis-specified,
    // so invalid parameters are reachable from most callers handling untrusted
    // private keys. (The |dsa_check_key| call above is not sufficient. Checking
    // whether arbitrary paremeters form a valid DSA group is expensive.)
    static const int kMaxIterations = 32;
    int iters = 0;
  redo:
    if (!dsa_sign_setup(dsa, ctx, &kinv, &r)) {
      goto err;
    }

    if (digest_len > BN_num_bytes(dsa->q)) {
      // If the digest length is greater than the size of |dsa->q| use the
      // BN_num_bits(dsa->q) leftmost bits of the digest, see FIPS 186-3, 4.2.
      // Note the above check that |dsa->q| is a multiple of 8 bits.
      digest_len = BN_num_bytes(dsa->q);
    }

    if (BN_bin2bn(digest, digest_len, &m) == NULL) {
      goto err;
    }

    // |m| is bounded by 2^(num_bits(q)), which is slightly looser than q. This
    // violates |bn_mod_add_consttime| and |mod_mul_consttime|'s preconditions.
    // (The underlying algorithms could accept looser bounds, but we reduce for
    // simplicity.)
    size_t q_width = bn_minimal_width(dsa->q);
    if (!bn_resize_words(&m, q_width) || !bn_resize_words(&xr, q_width)) {
      goto err;
    }
    bn_reduce_once_in_place(m.d, 0 /* no carry word */, dsa->q->d,
                            xr.d /* scratch space */, q_width);

    // Compute s = inv(k) (m + xr) mod q. Note |dsa->method_mont_q| is
    // initialized by |dsa_sign_setup|.
    if (!mod_mul_consttime(&xr, dsa->priv_key, r, dsa->method_mont_q, ctx) ||
        !bn_mod_add_consttime(s, &xr, &m, dsa->q, ctx) ||
        !mod_mul_consttime(s, s, kinv, dsa->method_mont_q, ctx)) {
      goto err;
    }

    // The signature is computed from the private key, but is public.
    bn_declassify(r);
    bn_declassify(s);

    // Redo if r or s is zero as required by FIPS 186-3: this is
    // very unlikely.
    if (BN_is_zero(r) || BN_is_zero(s)) {
      iters++;
      if (iters > kMaxIterations) {
        OPENSSL_PUT_ERROR(DSA, DSA_R_TOO_MANY_ITERATIONS);
        goto err;
      }
      goto redo;
    }

    ret = DSA_SIG_new();
    if (ret == NULL) {
      goto err;
    }
    ret->r = r;
    ret->s = s;
  }

err:
  if (ret == NULL) {
    OPENSSL_PUT_ERROR(DSA, ERR_R_BN_LIB);
    BN_free(r);
    BN_free(s);
  }
  BN_CTX_free(ctx);
  BN_clear_free(&m);
  BN_clear_free(&xr);
  BN_clear_free(kinv);

  return ret;
}